

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompression.cpp
# Opt level: O3

void __thiscall
duckdb::CompressedStringScanState::Initialize
          (CompressedStringScanState *this,ColumnSegment *segment,bool initialize_dictionary)

{
  uint uVar1;
  uint uVar2;
  uint32_t dict_offset;
  BufferHandle *pBVar3;
  BlockManager *pBVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var5;
  size_type sVar6;
  BlockHandle *pBVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  type pVVar11;
  IOException *this_01;
  ulong uVar12;
  data_ptr_t pdVar13;
  string_t sVar14;
  string local_58;
  
  optional_ptr<duckdb::BufferHandle,_true>::CheckValid(&this->handle);
  pBVar3 = (this->handle).ptr;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar3->node);
  pdVar13 = ((pBVar3->node).ptr)->buffer;
  iVar10 = segment->offset;
  this->baseptr = pdVar13 + iVar10;
  uVar1 = *(uint *)(pdVar13 + iVar10 + 8);
  uVar2 = *(uint *)(pdVar13 + iVar10 + 0xc);
  this->index_buffer_count = uVar2;
  this->current_width = pdVar13[iVar10 + 0x10];
  pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  pBVar4 = pBVar7->block_manager;
  iVar8 = optional_idx::GetIndex(&pBVar4->block_alloc_size);
  iVar9 = optional_idx::GetIndex(&pBVar4->block_header_size);
  if (iVar10 + uVar1 + (ulong)uVar2 * 4 <= iVar8 - iVar9) {
    this->index_buffer_ptr = (uint32_t *)(this->baseptr + uVar1);
    this->base_data = this->baseptr + 0x14;
    pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
    pBVar4 = pBVar7->block_manager;
    iVar10 = optional_idx::GetIndex(&pBVar4->block_alloc_size);
    iVar8 = optional_idx::GetIndex(&pBVar4->block_header_size);
    this->block_size = iVar10 - iVar8;
    optional_ptr<duckdb::BufferHandle,_true>::CheckValid(&this->handle);
    pBVar3 = (this->handle).ptr;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar3->node);
    this->dict = *(StringDictionaryContainer *)(((pBVar3->node).ptr)->buffer + segment->offset);
    if (initialize_dictionary) {
      make_buffer<duckdb::Vector,duckdb::LogicalType&,unsigned_int&>
                ((duckdb *)&local_58,&segment->type,&this->index_buffer_count);
      sVar6 = local_58._M_string_length;
      _Var5._M_p = local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      this_00 = (this->dictionary).internal.
                super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->dictionary).internal.super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var5._M_p;
      (this->dictionary).internal.super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
        }
      }
      this->dictionary_size = (ulong)this->index_buffer_count;
      pVVar11 = shared_ptr<duckdb::Vector,_true>::operator*(&this->dictionary);
      pdVar13 = pVVar11->data;
      pVVar11 = shared_ptr<duckdb::Vector,_true>::operator*(&this->dictionary);
      FlatVector::SetNull(pVVar11,0,true);
      if (1 < this->index_buffer_count) {
        pdVar13 = pdVar13 + 0x18;
        uVar12 = 1;
        do {
          dict_offset = this->index_buffer_ptr[uVar12];
          sVar14 = FetchStringFromDict(this,dict_offset,
                                       (short)dict_offset -
                                       (short)this->index_buffer_ptr[uVar12 - 1]);
          *(long *)(pdVar13 + -8) = sVar14.value._0_8_;
          *(long *)pdVar13 = sVar14.value._8_8_;
          uVar12 = uVar12 + 1;
          pdVar13 = pdVar13 + 0x10;
        } while (uVar12 < this->index_buffer_count);
      }
    }
    return;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "Failed to scan dictionary string - index was out of range. Database file appears to be corrupted."
             ,"");
  IOException::IOException(this_01,&local_58);
  __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompressedStringScanState::Initialize(ColumnSegment &segment, bool initialize_dictionary) {
	baseptr = handle->Ptr() + segment.GetBlockOffset();

	// Load header values
	auto header_ptr = reinterpret_cast<dictionary_compression_header_t *>(baseptr);
	auto index_buffer_offset = Load<uint32_t>(data_ptr_cast(&header_ptr->index_buffer_offset));
	index_buffer_count = Load<uint32_t>(data_ptr_cast(&header_ptr->index_buffer_count));
	current_width = (bitpacking_width_t)(Load<uint32_t>(data_ptr_cast(&header_ptr->bitpacking_width)));
	if (segment.GetBlockOffset() + index_buffer_offset + sizeof(uint32_t) * index_buffer_count >
	    segment.GetBlockManager().GetBlockSize()) {
		throw IOException(
		    "Failed to scan dictionary string - index was out of range. Database file appears to be corrupted.");
	}
	index_buffer_ptr = reinterpret_cast<uint32_t *>(baseptr + index_buffer_offset);
	base_data = data_ptr_cast(baseptr + DictionaryCompression::DICTIONARY_HEADER_SIZE);

	block_size = segment.GetBlockManager().GetBlockSize();

	dict = DictionaryCompression::GetDictionary(segment, *handle);
	if (!initialize_dictionary) {
		// Used by fetch, as fetch will never produce a DictionaryVector
		return;
	}

	dictionary = make_buffer<Vector>(segment.type, index_buffer_count);
	dictionary_size = index_buffer_count;
	auto dict_child_data = FlatVector::GetData<string_t>(*(dictionary));
	FlatVector::SetNull(*dictionary, 0, true);
	for (uint32_t i = 1; i < index_buffer_count; i++) {
		// NOTE: the passing of dict_child_vector, will not be used, its for big strings
		uint16_t str_len = GetStringLength(i);
		dict_child_data[i] = FetchStringFromDict(UnsafeNumericCast<int32_t>(index_buffer_ptr[i]), str_len);
	}
}